

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

void __thiscall DIntermissionScreenText::Drawer(DIntermissionScreenText *this)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  undefined4 extraout_var;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int local_48;
  int local_44;
  FRemapTable *local_40;
  int local_34;
  
  DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
  iVar8 = (this->super_DIntermissionScreen).mTicker;
  iVar3 = iVar8 - this->mTextDelay;
  if (this->mTextDelay <= iVar8) {
    local_40 = (FRemapTable *)CONCAT44(local_40._4_4_,iVar3);
    local_34 = SmallFont->GlobalKerning;
    iVar8 = 1;
    pcVar2 = this->mText;
    for (pcVar5 = pcVar2; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
      iVar8 = iVar8 + (uint)(*pcVar5 == '\n');
    }
    uVar11 = -(uint)(((undefined1)gameinfo.gametype & GAME_DoomStrifeChex) == GAME_Any) | 3;
    uVar10 = uVar11 * CleanYfac;
    iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    local_44 = (screen->super_DSimpleCanvas).super_DCanvas.Width / 2 +
               (this->mTextX + -0xa0) * CleanXfac;
    iVar9 = this->mTextY + -100;
    iVar7 = iVar9 * CleanYfac + iVar6 / 2;
    iVar12 = uVar11 + SmallFont->FontHeight;
    uVar4 = (int)uVar10 >> 0x1f & uVar10;
    iVar14 = (iVar12 * iVar8 + (iVar9 - uVar11)) * CleanYfac + iVar6 / 2;
    iVar12 = iVar12 * CleanYfac;
    iVar9 = iVar12 * iVar8;
    for (; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
      if (iVar14 <= iVar6) goto LAB_00326a14;
      iVar14 = iVar14 + (1 - iVar8);
      iVar12 = iVar12 + -1;
      iVar9 = iVar9 - iVar8;
    }
    iVar12 = CleanYfac * SmallFont->FontHeight + uVar4;
    iVar9 = iVar8 * iVar12;
    iVar14 = (iVar7 - uVar4) + iVar9;
    uVar10 = uVar4;
LAB_00326a14:
    if (iVar6 < iVar14) {
      iVar8 = (int)((uVar10 + iVar6) - iVar9) / 2;
      iVar7 = 0;
      if (0 < iVar8) {
        iVar7 = iVar8;
      }
    }
    iVar8 = this->mTextSpeed;
    local_40 = FFont::GetColorTranslation(SmallFont,this->mTextColor);
    iVar6 = local_44;
    for (lVar13 = 0; iVar3 / iVar8 != lVar13; lVar13 = lVar13 + 1) {
      cVar1 = pcVar2[lVar13];
      if (cVar1 == '\n') {
        iVar7 = iVar7 + iVar12;
        iVar9 = local_44;
      }
      else {
        if (cVar1 == '\0') {
          return;
        }
        iVar14 = (*SmallFont->_vptr_FFont[2])(SmallFont,(ulong)(uint)(int)cVar1,&local_48);
        local_48 = (local_48 + local_34) * CleanXfac;
        iVar9 = iVar6;
        if ((local_48 + iVar6 <= (screen->super_DSimpleCanvas).super_DCanvas.Width) &&
           (iVar9 = local_48 + iVar6, (FTexture *)CONCAT44(extraout_var,iVar14) != (FTexture *)0x0))
        {
          DCanvas::DrawTexture
                    ((DCanvas *)screen,(FTexture *)CONCAT44(extraout_var,iVar14),(double)iVar6,
                     (double)iVar7,0x4000138e,local_40,0x40001393,1,0);
          iVar9 = iVar6 + local_48;
        }
      }
      iVar6 = iVar9;
    }
  }
  return;
}

Assistant:

void DIntermissionScreenText::Drawer ()
{
	Super::Drawer();
	if (mTicker >= mTextDelay)
	{
		FTexture *pic;
		int w;
		size_t count;
		int c;
		const FRemapTable *range;
		const char *ch = mText;
		const int kerning = SmallFont->GetDefaultKerning();

		// Count number of rows in this text. Since it does not word-wrap, we just count
		// line feed characters.
		int numrows;

		for (numrows = 1, c = 0; ch[c] != '\0'; ++c)
		{
			numrows += (ch[c] == '\n');
		}

		int rowheight = SmallFont->GetHeight() * CleanYfac;
		int rowpadding = (gameinfo.gametype & (GAME_DoomStrifeChex) ? 3 : -1) * CleanYfac;

		int cx = (mTextX - 160)*CleanXfac + screen->GetWidth() / 2;
		int cy = (mTextY - 100)*CleanYfac + screen->GetHeight() / 2;
		int startx = cx;

		// Does this text fall off the end of the screen? If so, try to eliminate some margins first.
		while (rowpadding > 0 && cy + numrows * (rowheight + rowpadding) - rowpadding > screen->GetHeight())
		{
			rowpadding--;
		}
		// If it's still off the bottom, try to center it vertically.
		if (cy + numrows * (rowheight + rowpadding) - rowpadding > screen->GetHeight())
		{
			cy = (screen->GetHeight() - (numrows * (rowheight + rowpadding) - rowpadding)) / 2;
			// If it's off the top now, you're screwed. It's too tall to fit.
			if (cy < 0)
			{
				cy = 0;
			}
		}
		rowheight += rowpadding;

		// draw some of the text onto the screen
		count = (mTicker - mTextDelay) / mTextSpeed;
		range = SmallFont->GetColorTranslation (mTextColor);

		for ( ; count > 0 ; count-- )
		{
			c = *ch++;
			if (!c)
				break;
			if (c == '\n')
			{
				cx = startx;
				cy += rowheight;
				continue;
			}

			pic = SmallFont->GetChar (c, &w);
			w += kerning;
			w *= CleanXfac;
			if (cx + w > SCREENWIDTH)
				continue;
			if (pic != NULL)
			{
				screen->DrawTexture (pic,
					cx,
					cy,
					DTA_Translation, range,
					DTA_CleanNoMove, true,
					TAG_DONE);
			}
			cx += w;
		}
	}
}